

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O0

void __thiscall choc::text::CodePrinter::append(CodePrinter *this,string *s)

{
  bool bVar1;
  ulong uVar2;
  reference pvVar3;
  string *this_00;
  size_t sVar4;
  string_view text;
  undefined1 auVar5 [16];
  value_type local_d8;
  string local_b0 [32];
  string local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> newLastLine;
  size_t splitPoint;
  string *last;
  value_type local_40;
  string *local_18;
  string *s_local;
  CodePrinter *this_local;
  
  local_18 = s;
  s_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = isLastLineActive(this);
    if (bVar1) {
      pvVar3 = std::
               vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
               ::back(&this->lines);
      std::__cxx11::string::operator+=((string *)&pvVar3->line,(string *)s);
    }
    else {
      local_40.indent = (size_t)this->indent;
      std::__cxx11::string::string((string *)&local_40.line,(string *)s);
      std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>::
      push_back(&this->lines,&local_40);
      Line::~Line(&local_40);
    }
    while( true ) {
      bVar1 = false;
      if (this->lineWrapLength != 0) {
        std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>::
        back(&this->lines);
        uVar2 = std::__cxx11::string::length();
        bVar1 = this->lineWrapLength < uVar2;
      }
      if (!bVar1) break;
      pvVar3 = std::
               vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
               ::back(&this->lines);
      this_00 = &pvVar3->line;
      auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      newLastLine.field_2._8_8_ = auVar5._0_8_;
      text._M_str = (char *)this->lineWrapLength;
      text._M_len = auVar5._8_8_;
      sVar4 = findLineSplitPoint((text *)newLastLine.field_2._8_8_,text,newLastLine.field_2._8_8_);
      uVar2 = std::__cxx11::string::size();
      if (uVar2 <= sVar4) {
        return;
      }
      std::__cxx11::string::substr((ulong)local_90,(ulong)this_00);
      std::__cxx11::string::substr((ulong)local_b0,(ulong)this_00);
      std::__cxx11::string::operator=((string *)this_00,local_b0);
      std::__cxx11::string::~string(local_b0);
      local_d8.indent = (size_t)this->indent;
      std::__cxx11::string::string((string *)&local_d8.line,local_90);
      std::vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>::
      push_back(&this->lines,&local_d8);
      Line::~Line(&local_d8);
      std::__cxx11::string::~string(local_90);
    }
  }
  return;
}

Assistant:

inline void CodePrinter::append (std::string s)
{
    if (! s.empty())
    {
        if (isLastLineActive())
            lines.back().line += std::move (s);
        else
            lines.push_back ({ static_cast<size_t> (indent), std::move (s) });

        while (lineWrapLength != 0 && lines.back().line.length() > lineWrapLength)
        {
            auto& last = lines.back().line;
            auto splitPoint = findLineSplitPoint (last, lineWrapLength);

            if (splitPoint >= last.size())
                break;

            auto newLastLine = last.substr (splitPoint);
            last = last.substr (0, splitPoint);
            lines.push_back ({ static_cast<size_t> (indent), std::move (newLastLine) });
        }
    }
}